

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySerializer.cpp
# Opt level: O2

string * __thiscall
ser::BinarySerializer::WriteArray_abi_cxx11_
          (string *__return_storage_ptr__,BinarySerializer *this,void *data,int bytesPerElement,
          int isize,int jsize,int ksize,int lsize,int istride,int jstride,int kstride,int lstride,
          vector<char,_std::allocator<char>_> *binaryData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pcVar6;
  ulong uVar7;
  int local_64;
  int local_60;
  
  std::vector<char,_std::allocator<char>_>::resize
            (binaryData,(long)(ksize * lsize * isize * bytesPerElement * jsize));
  if (isize < 1) {
    isize = 0;
  }
  pcVar6 = (binaryData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (jsize < 1) {
    jsize = 0;
  }
  if (ksize < 1) {
    ksize = 0;
  }
  local_64 = 0;
  if (lsize < 1) {
    lsize = 0;
  }
  for (iVar3 = 0; iVar3 != lsize; iVar3 = iVar3 + 1) {
    local_60 = local_64;
    for (iVar2 = 0; iVar2 != ksize; iVar2 = iVar2 + 1) {
      iVar5 = local_60;
      for (iVar4 = 0; uVar7 = (ulong)(uint)isize, iVar1 = iVar5, iVar4 != jsize; iVar4 = iVar4 + 1)
      {
        while (uVar7 != 0) {
          memcpy(pcVar6,(void *)((long)data + (long)iVar1),(long)bytesPerElement);
          pcVar6 = pcVar6 + bytesPerElement;
          uVar7 = uVar7 - 1;
          iVar1 = iVar1 + istride;
        }
        iVar5 = iVar5 + jstride;
      }
      local_60 = local_60 + kstride;
    }
    local_64 = local_64 + lstride;
  }
  pcVar6 = (binaryData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  computeChecksum_abi_cxx11_
            (__return_storage_ptr__,pcVar6,
             *(int *)&(binaryData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (int)pcVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string BinarySerializer::WriteArray(const void* data, int bytesPerElement,
        int isize, int jsize, int ksize, int lsize,
        int istride, int jstride, int kstride, int lstride,
        std::vector<char>& binaryData) const
{
    const char* pData = reinterpret_cast<const char*>(data);

    // Compute data size and reserve memory
    const int dataSize = bytesPerElement * (isize*jsize*ksize*lsize);
    binaryData.resize(dataSize);
    char* pVec = binaryData.data();

    // Write data in column-major (fortran) ordering
    for (int l = 0; l < lsize; ++l)
        for (int k = 0; k < ksize; ++k)
            for (int j = 0; j < jsize; ++j)
                for (int i = 0; i < isize; ++i)
                {
                    const char* pIn = pData + (i*istride + j*jstride + k*kstride + l*lstride);
                    std::memcpy(pVec, pIn, bytesPerElement);
                    pVec += bytesPerElement;
                }

    // Compute checksum
    return computeChecksum(binaryData.data(), binaryData.size());
}